

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O2

void __thiscall nvtt::OutputOptions::OutputOptions(OutputOptions *this)

{
  Private *this_00;
  
  this_00 = (Private *)operator_new(0x28);
  *(undefined8 *)&(this_00->fileName).super_StringBuilder = 0;
  (this_00->fileName).super_StringBuilder.m_str = (char *)0x0;
  this_00->outputHandler = (OutputHandler *)0x0;
  this_00->errorHandler = (ErrorHandler *)0x0;
  *(undefined8 *)&this_00->outputHeader = 0;
  nv::StringBuilder::StringBuilder((StringBuilder *)this_00);
  this->m = this_00;
  reset(this);
  return;
}

Assistant:

OutputOptions::OutputOptions() : m(*new OutputOptions::Private())
{
	reset();
}